

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ls_abi_cxx11_(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *__return_storage_ptr__,char *dir_name)

{
  DIR *__dirp;
  dirent *pdVar1;
  size_t sVar2;
  char *__s;
  string s;
  stat sb;
  char buf [512];
  value_type local_2e8;
  stat local_2c8;
  char local_238 [520];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __dirp = opendir(dir_name);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar1 = readdir(__dirp);
      if (pdVar1 == (dirent *)0x0) break;
      __s = pdVar1->d_name;
      sprintf(local_238,"%s/%s",dir_name,__s);
      stat(local_238,&local_2c8);
      if ((local_2c8.st_mode & 0xf000) != 0x4000) {
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        sVar2 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,__s,__s + sVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<String> ls(const char * dir_name){
    Vector<String> result;
    DIR *mydir = opendir(dir_name);
    if(mydir != NULL){
        char buf[512];
        struct dirent *myfile;
        while((myfile = readdir(mydir)) != NULL){
            struct stat sb;
            sprintf(buf, "%s/%s",dir_name, myfile->d_name);
            stat(buf, &sb);
            if(!S_ISDIR(sb.st_mode)!=0){\
                String s = myfile->d_name;
                result.push_back(s);
            }
        }
    }
    return result;
}